

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labels_solver.h
# Opt level: O0

uint UFPC::MemMerge(uint i,uint j)

{
  uint uVar1;
  uint *puVar2;
  uint t_1;
  uint t;
  uint root_j;
  uint root;
  uint j_local;
  uint i_local;
  
  t = i;
  while (puVar2 = MemVector<unsigned_int>::operator[](&mem_P_,t), *puVar2 < t) {
    puVar2 = MemVector<unsigned_int>::operator[](&mem_P_,t);
    t = *puVar2;
  }
  t_1 = j;
  root = i;
  if (i != j) {
    while (puVar2 = MemVector<unsigned_int>::operator[](&mem_P_,t_1), *puVar2 < t_1) {
      puVar2 = MemVector<unsigned_int>::operator[](&mem_P_,t_1);
      t_1 = *puVar2;
    }
    root_j = j;
    if (t_1 < t) {
      t = t_1;
    }
    while (puVar2 = MemVector<unsigned_int>::operator[](&mem_P_,root_j), *puVar2 < root_j) {
      puVar2 = MemVector<unsigned_int>::operator[](&mem_P_,root_j);
      uVar1 = *puVar2;
      puVar2 = MemVector<unsigned_int>::operator[](&mem_P_,root_j);
      *puVar2 = t;
      root_j = uVar1;
    }
    puVar2 = MemVector<unsigned_int>::operator[](&mem_P_,root_j);
    *puVar2 = t;
  }
  while (puVar2 = MemVector<unsigned_int>::operator[](&mem_P_,root), *puVar2 < root) {
    puVar2 = MemVector<unsigned_int>::operator[](&mem_P_,root);
    uVar1 = *puVar2;
    puVar2 = MemVector<unsigned_int>::operator[](&mem_P_,root);
    *puVar2 = t;
    root = uVar1;
  }
  puVar2 = MemVector<unsigned_int>::operator[](&mem_P_,root);
  *puVar2 = t;
  return t;
}

Assistant:

static unsigned MemMerge(unsigned i, unsigned j)
    {
        // FindRoot(i)
        unsigned root(i);
        while (mem_P_[root] < root) {
            root = mem_P_[root];
        }
        if (i != j) {
            // FindRoot(j)
            unsigned root_j(j);
            while (mem_P_[root_j] < root_j) {
                root_j = mem_P_[root_j];
            }
            if (root > root_j) {
                root = root_j;
            }
            // SetRoot(j, root);
            while (mem_P_[j] < j) {
                unsigned t = mem_P_[j];
                mem_P_[j] = root;
                j = t;
            }
            mem_P_[j] = root;
        }
        // SetRoot(i, root);
        while (mem_P_[i] < i) {
            unsigned t = mem_P_[i];
            mem_P_[i] = root;
            i = t;
        }
        mem_P_[i] = root;
        return root;
    }